

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  byte bVar1;
  MCOperandInfo *pMVar2;
  _Bool _Var3;
  uint uVar4;
  int index;
  MCOperand *pMVar5;
  MCInst *in_RSI;
  long in_RDI;
  uint CC;
  uint i;
  unsigned_short NumOps;
  MCOperandInfo *OpInfo;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_34;
  uint local_30;
  DecodeStatus local_1c;
  
  local_1c = MCDisassembler_Success;
  uVar4 = MCInst_getOpcode(in_RSI);
  if (uVar4 == 0x903) {
LAB_0025fb36:
    _Var3 = ITStatus_instrInITBlock((ARM_ITStatus *)(in_RDI + 0x54));
    if ((_Var3) && (_Var3 = ITStatus_instrLastInITBlock((ARM_ITStatus *)(in_RDI + 0x54)), !_Var3)) {
      local_1c = MCDisassembler_SoftFail;
    }
  }
  else {
    if ((uVar4 != 0x90b) && (2 < uVar4 - 0x916)) {
      if ((uVar4 == 0xa5b) || ((uVar4 == 0xa5d || (uVar4 == 0xa97)))) goto LAB_0025fb36;
      if ((((uVar4 != 0xaa3) && (1 < uVar4 - 0xaa5)) && (uVar4 != 0xaab)) &&
         ((uVar4 != 0xac7 && (uVar4 != 0xad7)))) goto LAB_0025fb6e;
    }
    _Var3 = ITStatus_instrInITBlock((ARM_ITStatus *)(in_RDI + 0x54));
    if (!_Var3) {
      return MCDisassembler_Success;
    }
    local_1c = MCDisassembler_SoftFail;
  }
LAB_0025fb6e:
  local_34 = ITStatus_getITCC((ARM_ITStatus *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (local_34 == 0xf) {
    local_34 = 0xe;
  }
  _Var3 = ITStatus_instrInITBlock((ARM_ITStatus *)(in_RDI + 0x54));
  if (_Var3) {
    ITStatus_advanceITState((ARM_ITStatus *)(in_RDI + 0x54));
  }
  uVar4 = MCInst_getOpcode(in_RSI);
  pMVar2 = ARMInsts[uVar4].OpInfo;
  uVar4 = MCInst_getOpcode(in_RSI);
  bVar1 = ARMInsts[uVar4].NumOperands;
  for (local_30 = 0;
      (local_30 < bVar1 && (uVar4 = MCInst_getNumOperands(in_RSI), local_30 != uVar4));
      local_30 = local_30 + 1) {
    _Var3 = MCOperandInfo_isPredicate(pMVar2 + local_30);
    if (_Var3) {
      pMVar5 = MCOperand_CreateImm1(in_RSI,(ulong)local_34);
      MCInst_insert0(in_RSI,local_30,pMVar5);
      if (local_34 == 0xe) {
        pMVar5 = MCOperand_CreateReg1(in_RSI,0);
        MCInst_insert0(in_RSI,local_30 + 1,pMVar5);
      }
      else {
        pMVar5 = MCOperand_CreateReg1(in_RSI,3);
        MCInst_insert0(in_RSI,local_30 + 1,pMVar5);
      }
      return local_1c;
    }
  }
  pMVar5 = MCOperand_CreateImm1(in_RSI,(ulong)local_34);
  MCInst_insert0(in_RSI,local_30,pMVar5);
  if (local_34 == 0xe) {
    pMVar5 = MCOperand_CreateReg1(in_RSI,0);
    MCInst_insert0(in_RSI,local_30 + 1,pMVar5);
  }
  else {
    index = local_30 + 1;
    pMVar5 = MCOperand_CreateReg1(in_RSI,3);
    MCInst_insert0(in_RSI,index,pMVar5);
  }
  return local_1c;
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	const MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}